

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thybrjc.c
# Opt level: O0

int main(void)

{
  char *pcVar1;
  double __x;
  void *p;
  double wa4 [9];
  double wa3 [9];
  double wa2 [9];
  double wa1 [9];
  double qtf [9];
  double r [45];
  double diag [9];
  double fjac [81];
  double fvec [9];
  double x [9];
  double fnorm;
  double factor;
  double xtol;
  int lr;
  int njev;
  int nfev;
  int info;
  int nprint;
  int mode;
  int maxfev;
  int ldfjac;
  int n;
  int j;
  double *x_00;
  int n_00;
  undefined1 local_6f8 [80];
  double in_stack_fffffffffffff958;
  double in_stack_fffffffffffff960;
  double *in_stack_fffffffffffff968;
  double *in_stack_fffffffffffff970;
  double *in_stack_fffffffffffff978;
  int in_stack_fffffffffffff984;
  void *in_stack_fffffffffffff988;
  cminpack_funcder_nn in_stack_fffffffffffff990;
  int in_stack_fffffffffffff9a0;
  int in_stack_fffffffffffff9a8;
  double *in_stack_fffffffffffff9b0;
  int in_stack_fffffffffffff9b8;
  int in_stack_fffffffffffff9c0;
  int *in_stack_fffffffffffff9c8;
  int *in_stack_fffffffffffff9d0;
  double *in_stack_fffffffffffff9d8;
  int in_stack_fffffffffffff9e0;
  double *in_stack_fffffffffffff9e8;
  double *in_stack_fffffffffffff9f0;
  double *in_stack_fffffffffffff9f8;
  double *in_stack_fffffffffffffa00;
  double *in_stack_fffffffffffffa08;
  undefined8 local_3f8 [102];
  undefined8 local_c8 [10];
  double local_78;
  undefined8 local_70;
  double local_68;
  undefined4 local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  int local_3c;
  int local_38;
  undefined4 local_34;
  
  local_34 = 0;
  local_3c = 9;
  for (local_38 = 1; local_38 < 10; local_38 = local_38 + 1) {
    local_c8[local_38 + -1] = 0xbff0000000000000;
  }
  local_40 = 9;
  local_5c = 0x2d;
  __x = dpmpar(1);
  local_68 = sqrt(__x);
  local_44 = 1000;
  local_48 = 2;
  for (local_38 = 1; local_38 < 10; local_38 = local_38 + 1) {
    local_3f8[local_38 + -1] = 0x3ff0000000000000;
  }
  local_70 = 0x4059000000000000;
  local_4c = 0;
  x_00 = (double *)&stack0xfffffffffffff958;
  n_00 = (int)((ulong)local_6f8 >> 0x20);
  local_50 = hybrj(in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff984,
                   in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                   in_stack_fffffffffffff9a0,in_stack_fffffffffffff960,in_stack_fffffffffffff9a8,
                   in_stack_fffffffffffff9b0,in_stack_fffffffffffff9b8,in_stack_fffffffffffff958,
                   in_stack_fffffffffffff9c0,in_stack_fffffffffffff9c8,in_stack_fffffffffffff9d0,
                   in_stack_fffffffffffff9d8,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9e8,
                   in_stack_fffffffffffff9f0,in_stack_fffffffffffff9f8,in_stack_fffffffffffffa00,
                   in_stack_fffffffffffffa08);
  local_78 = enorm(n_00,x_00);
  printf("     final l2 norm of the residuals%15.7g\n\n",local_78);
  printf("     number of function evaluations%10i\n\n",(ulong)local_54);
  printf("     number of jacobian evaluations%10i\n\n",(ulong)local_58);
  printf("     exit parameter                %10i\n\n",(ulong)local_50);
  printf("     final approximate solution\n\n");
  for (local_38 = 1; local_38 <= local_3c; local_38 = local_38 + 1) {
    pcVar1 = "";
    if (local_38 % 3 == 1) {
      pcVar1 = "\n     ";
    }
    printf("%s%15.7g",local_c8[local_38 + -1],pcVar1);
  }
  printf("\n");
  return 0;
}

Assistant:

int main()
{
#if (defined(__MINGW32__) && !defined(_UCRT)) || (defined(_MSC_VER) && (_MSC_VER < 1900))
  _set_output_format(_TWO_DIGIT_EXPONENT);
#endif

  int j, n, ldfjac, maxfev, mode, nprint, info, nfev, njev, lr;
  real xtol, factor, fnorm;
  real x[9], fvec[9], fjac[9*9], diag[9], r[45], qtf[9],
    wa1[9], wa2[9], wa3[9], wa4[9];
  void *p = NULL;
#ifdef BOX_CONSTRAINTS
  real xmin[9] = {-2.,-0.5, -2., -2., -2., -2., -2., -2., -2.};
  real xmax[9] = { 2.,  2.,  2.,  2.,  2.,  2.,  2.,  2.,  2.};
  fcndata_t data;
  data.xmin = xmin;
  data.xmax = xmax;
  p = &data;
#endif

  n = 9;

/*      the following starting values provide a rough solution. */

  for (j=1; j<=9; j++) {
    x[j-1] = -1.;
  }

  ldfjac = 9;
  lr = 45;

/*      set xtol to the square root of the machine precision. */
/*      unless high solutions are required, */
/*      this is the recommended setting. */

  xtol = sqrt(__cminpack_func__(dpmpar)(1));

  maxfev = 1000;
  mode = 2;
  for (j=1; j<=9; j++) {
    diag[j-1] = 1.;
  }
  factor = 1.e2;
  nprint = 0;

  info = __cminpack_func__(hybrj)(fcn, p, n, x, fvec, fjac, ldfjac, xtol, maxfev, diag, 
	mode, factor, nprint, &nfev, &njev, r, lr, qtf, 
	wa1, wa2, wa3, wa4);
#ifdef BOX_CONSTRAINTS
  /* compute the real x, using the same change of variable as in fcn */
  for (j = 0; j < 3; ++j) {
    real xmiddle = (xmin[j]+xmax[j])/2.;
    real xwidth = (xmax[j]-xmin[j])/2.;
    real th =  tanh((x[j]-xmiddle)/xwidth);
    x[j] = xmiddle + th * xwidth;
  }
#endif
 fnorm = __cminpack_func__(enorm)(n, fvec);

 printf("     final l2 norm of the residuals%15.7g\n\n", (double)fnorm);
 printf("     number of function evaluations%10i\n\n", nfev);
 printf("     number of jacobian evaluations%10i\n\n", njev);
 printf("     exit parameter                %10i\n\n", info);
 printf("     final approximate solution\n\n");
 for (j=1; j<=n; j++) {
   printf("%s%15.7g", j%3==1?"\n     ":"", (double)x[j-1]);
 }
 printf("\n");
 return 0;
}